

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::SetWacc_loc(ChFrameMoving<double> *this,ChVector<double> *al)

{
  ChQuaternion<double> *this_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  ChQuaternion<double> local_f0;
  ChQuaternion<double> local_d0;
  ChQuaternion<double> local_b0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  local_b0.m_data[0] = (this->super_ChFrame<double>).coord.rot.m_data[0];
  this_00 = &(this->coord_dt).rot;
  auVar2._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_b0.m_data[1]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 1);
  local_b0.m_data[2]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 2);
  local_b0.m_data[1]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0xc) ^ 0x80000000;
  local_b0.m_data[2]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0x14) ^ 0x80000000;
  local_b0.m_data[3] = (double)vmovlps_avx(auVar2);
  ChQuaternion<double>::operator%(&local_90,this_00,&local_b0);
  ChQuaternion<double>::operator%(&local_70,&local_90,this_00);
  local_f0.m_data[0] = 0.0;
  local_f0.m_data[1] = al->m_data[0];
  local_f0.m_data[2] = al->m_data[1];
  local_f0.m_data[3] = al->m_data[2];
  ChQuaternion<double>::operator%(&local_d0,&(this->super_ChFrame<double>).coord.rot,&local_f0);
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  auVar1._16_8_ = 0x3fe0000000000000;
  auVar1._24_8_ = 0x3fe0000000000000;
  auVar1 = vmulpd_avx512vl((undefined1  [32])local_d0.m_data,auVar1);
  local_50.m_data[0] = auVar1._0_8_ + local_70.m_data[0];
  local_50.m_data[1] = auVar1._8_8_ + local_70.m_data[1];
  local_50.m_data[2] = auVar1._16_8_ + local_70.m_data[2];
  local_50.m_data[3] = auVar1._24_8_ + local_70.m_data[3];
  ChQuaternion<double>::operator=(&(this->coord_dtdt).rot,&local_50);
  return;
}

Assistant:

virtual void SetWacc_loc(const ChVector<Real>& al) {
        // q_dtdt = q_dt * q' * q_dt + 1/2 * q * (0,al)
        coord_dtdt.rot = (coord_dt.rot % this->coord.rot.GetConjugate() % coord_dt.rot) +
                         (this->coord.rot % ChQuaternion<Real>(0, al) * (Real)0.5);
    }